

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

compressed_lower_distance_matrix * read_lower_distance_matrix(istream *input_stream)

{
  bool bVar1;
  value_type_conflict1 *__x;
  istream *in_RSI;
  compressed_lower_distance_matrix *in_RDI;
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  compressed_lower_distance_matrix *this;
  float local_2c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffd8;
  compressed_distance_matrix<(compressed_matrix_layout)0> *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x149e25);
  while( true ) {
    __x = (value_type_conflict1 *)std::istream::operator>>(in_RSI,&local_2c);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)__x + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    std::vector<float,_std::allocator<float>_>::push_back(&this->distances,__x);
    std::istream::ignore();
  }
  compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<float,_std::allocator<float>_>::~vector(&this->distances);
  return in_RDI;
}

Assistant:

compressed_lower_distance_matrix read_lower_distance_matrix(std::istream& input_stream) {
	std::vector<value_t> distances;
	value_t value;
	while (input_stream >> value) {
		distances.push_back(value);
		input_stream.ignore();
	}

	return compressed_lower_distance_matrix(std::move(distances));
}